

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O1

EntryType * __thiscall
JsUtil::
BaseDictionary<Js::EvalMapStringInternal<false>,_Js::FunctionInfo_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
::AllocateEntries(BaseDictionary<Js::EvalMapStringInternal<false>,_Js::FunctionInfo_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                  *this,int size,bool zeroAllocate)

{
  undefined1 auVar1 [16];
  KeyValueEntry<Js::EvalMapStringInternal<false>,_Memory::WriteBarrierPtr<Js::FunctionInfo>_>
  *pKVar2;
  Recycler *this_00;
  EntryType *pEVar3;
  code *AllocFunc;
  EntryType *pEVar4;
  ulong uVar5;
  size_t byteSize;
  undefined1 local_40 [8];
  TrackAllocData data;
  
  uVar5 = (ulong)size;
  local_40 = (undefined1  [8])
             &SimpleDictionaryEntry<Js::EvalMapStringInternal<false>,Memory::WriteBarrierPtr<Js::FunctionInfo>>
              ::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.count = (size_t)anon_var_dwarf_136c13;
  data.filename._0_4_ = 0x453;
  data.plusSize = uVar5;
  this_00 = Memory::Recycler::TrackAllocInfo(this->alloc,(TrackAllocData *)local_40);
  if (size == 0) {
    Memory::Recycler::ClearTrackAllocInfo(this_00,(TrackAllocData *)0x0);
    pEVar3 = (EntryType *)&DAT_00000008;
  }
  else {
    if (zeroAllocate) {
      AllocFunc = Memory::Recycler::AllocZeroWithBarrier;
    }
    else {
      AllocFunc = Memory::Recycler::AllocWithBarrier;
    }
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar5;
    byteSize = 0xffffffffffffffff;
    if (SUB168(auVar1 * ZEXT816(0x38),8) == 0) {
      byteSize = SUB168(auVar1 * ZEXT816(0x38),0);
    }
    pEVar3 = (EntryType *)
             new__<Memory::Recycler>(byteSize,this_00,(offset_in_Recycler_to_subr)AllocFunc);
    pEVar4 = pEVar3;
    do {
      (pEVar4->
      super_DefaultHashedEntry<Js::EvalMapStringInternal<false>,_Memory::WriteBarrierPtr<Js::FunctionInfo>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
      ).
      super_KeyValueEntry<Js::EvalMapStringInternal<false>,_Memory::WriteBarrierPtr<Js::FunctionInfo>_>
      .
      super_ValueEntry<Memory::WriteBarrierPtr<Js::FunctionInfo>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Js::EvalMapStringInternal<false>,_Memory::WriteBarrierPtr<Js::FunctionInfo>_>_>
      .
      super_KeyValueEntryDataLayout2<Js::EvalMapStringInternal<false>,_Memory::WriteBarrierPtr<Js::FunctionInfo>_>
      .value.ptr = (FunctionInfo *)0x0;
      (pEVar4->
      super_DefaultHashedEntry<Js::EvalMapStringInternal<false>,_Memory::WriteBarrierPtr<Js::FunctionInfo>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
      ).
      super_KeyValueEntry<Js::EvalMapStringInternal<false>,_Memory::WriteBarrierPtr<Js::FunctionInfo>_>
      .
      super_ValueEntry<Memory::WriteBarrierPtr<Js::FunctionInfo>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Js::EvalMapStringInternal<false>,_Memory::WriteBarrierPtr<Js::FunctionInfo>_>_>
      .
      super_KeyValueEntryDataLayout2<Js::EvalMapStringInternal<false>,_Memory::WriteBarrierPtr<Js::FunctionInfo>_>
      .key.owningVar = (FinalizableObject *)0x0;
      (pEVar4->
      super_DefaultHashedEntry<Js::EvalMapStringInternal<false>,_Memory::WriteBarrierPtr<Js::FunctionInfo>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
      ).
      super_KeyValueEntry<Js::EvalMapStringInternal<false>,_Memory::WriteBarrierPtr<Js::FunctionInfo>_>
      .
      super_ValueEntry<Memory::WriteBarrierPtr<Js::FunctionInfo>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Js::EvalMapStringInternal<false>,_Memory::WriteBarrierPtr<Js::FunctionInfo>_>_>
      .
      super_KeyValueEntryDataLayout2<Js::EvalMapStringInternal<false>,_Memory::WriteBarrierPtr<Js::FunctionInfo>_>
      .key.str.string.ptr = (char16_t *)0x0;
      (pEVar4->
      super_DefaultHashedEntry<Js::EvalMapStringInternal<false>,_Memory::WriteBarrierPtr<Js::FunctionInfo>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
      ).
      super_KeyValueEntry<Js::EvalMapStringInternal<false>,_Memory::WriteBarrierPtr<Js::FunctionInfo>_>
      .
      super_ValueEntry<Memory::WriteBarrierPtr<Js::FunctionInfo>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Js::EvalMapStringInternal<false>,_Memory::WriteBarrierPtr<Js::FunctionInfo>_>_>
      .
      super_KeyValueEntryDataLayout2<Js::EvalMapStringInternal<false>,_Memory::WriteBarrierPtr<Js::FunctionInfo>_>
      .key.str.len = 0xffffffff;
      pKVar2 = &(pEVar4->
                super_DefaultHashedEntry<Js::EvalMapStringInternal<false>,_Memory::WriteBarrierPtr<Js::FunctionInfo>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                ).
                super_KeyValueEntry<Js::EvalMapStringInternal<false>,_Memory::WriteBarrierPtr<Js::FunctionInfo>_>
      ;
      (pKVar2->
      super_ValueEntry<Memory::WriteBarrierPtr<Js::FunctionInfo>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Js::EvalMapStringInternal<false>,_Memory::WriteBarrierPtr<Js::FunctionInfo>_>_>
      ).
      super_KeyValueEntryDataLayout2<Js::EvalMapStringInternal<false>,_Memory::WriteBarrierPtr<Js::FunctionInfo>_>
      .key.hash = 0;
      (pKVar2->
      super_ValueEntry<Memory::WriteBarrierPtr<Js::FunctionInfo>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Js::EvalMapStringInternal<false>,_Memory::WriteBarrierPtr<Js::FunctionInfo>_>_>
      ).
      super_KeyValueEntryDataLayout2<Js::EvalMapStringInternal<false>,_Memory::WriteBarrierPtr<Js::FunctionInfo>_>
      .key.moduleID = 0;
      pKVar2 = &(pEVar4->
                super_DefaultHashedEntry<Js::EvalMapStringInternal<false>,_Memory::WriteBarrierPtr<Js::FunctionInfo>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                ).
                super_KeyValueEntry<Js::EvalMapStringInternal<false>,_Memory::WriteBarrierPtr<Js::FunctionInfo>_>
      ;
      (pKVar2->
      super_ValueEntry<Memory::WriteBarrierPtr<Js::FunctionInfo>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Js::EvalMapStringInternal<false>,_Memory::WriteBarrierPtr<Js::FunctionInfo>_>_>
      ).
      super_KeyValueEntryDataLayout2<Js::EvalMapStringInternal<false>,_Memory::WriteBarrierPtr<Js::FunctionInfo>_>
      .key.strict = 0;
      (pKVar2->
      super_ValueEntry<Memory::WriteBarrierPtr<Js::FunctionInfo>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Js::EvalMapStringInternal<false>,_Memory::WriteBarrierPtr<Js::FunctionInfo>_>_>
      ).
      super_KeyValueEntryDataLayout2<Js::EvalMapStringInternal<false>,_Memory::WriteBarrierPtr<Js::FunctionInfo>_>
      .key.isLibraryCode = 0;
      pEVar4 = pEVar4 + 1;
    } while (pEVar4 != pEVar3 + uVar5);
  }
  return pEVar3;
}

Assistant:

EntryType * AllocateEntries(DECLSPEC_GUARD_OVERFLOW int size, const bool zeroAllocate = true)
        {
            // Note that the choice of leaf/non-leaf node is decided for the EntryType on the basis of TValue. By default, if
            // TValue is a pointer, a non-leaf allocation is done. This behavior can be overridden by specializing
            // TypeAllocatorFunc for TValue.
            return
                AllocateArray<AllocatorType, EntryType, false>(
                    TRACK_ALLOC_INFO(alloc, EntryType, AllocatorType, 0, size),
                    zeroAllocate ? EntryAllocatorFuncType::GetAllocZeroFunc() : EntryAllocatorFuncType::GetAllocFunc(),
                    size);
        }